

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::
addEvent<boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,deque<int,_void,_void> *args,
          list<int,_void> *args_1,slist<int,_void> *args_2,vector<int,_void,_void> *args_3)

{
  header_holder_type *phVar1;
  header_holder_plus_last_t *phVar2;
  ulong uVar3;
  QueueWriter *this_00;
  char **ppcVar4;
  int *piVar5;
  bool bVar6;
  size_t sVar7;
  char *pcVar8;
  int *piVar9;
  int iVar10;
  node_ptr plVar11;
  header_holder_plus_last_t hVar12;
  node_ptr psVar13;
  index_pointer ppiVar14;
  long lVar15;
  int *piVar16;
  int *piVar17;
  const_iterator __end0_1;
  size_t __n;
  const_iterator __end0;
  long lVar18;
  long lVar19;
  size_t sizes [6];
  long local_68 [7];
  
  local_68[0] = 8;
  local_68[1] = 8;
  piVar9 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_start.
           m_cur;
  piVar5 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_finish.
           m_cur;
  if (piVar9 == piVar5) {
    local_68[2] = 4;
  }
  else {
    ppiVar14 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_start
               .m_node;
    piVar17 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_start.
              m_first;
    piVar16 = (args->super_deque_base<boost::container::new_allocator<int>,_void>).members_.m_start.
              m_last;
    local_68[2] = 4;
    do {
      piVar9 = piVar9 + 1;
      if (piVar9 == piVar16) {
        lVar15 = (long)piVar16 - (long)piVar17;
        piVar17 = ppiVar14[1];
        ppiVar14 = ppiVar14 + 1;
        piVar16 = (int *)(lVar15 + (long)piVar17);
        piVar9 = piVar17;
      }
      local_68[2] = local_68[2] + 4;
    } while (piVar9 != piVar5);
  }
  phVar1 = &(args_1->
            super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
            ).m_icont.data_.root_plus_size_.m_header;
  local_68[3] = 0;
  plVar11 = &phVar1->super_node;
  do {
    plVar11 = ((node *)&plVar11->next_)->next_;
    local_68[3] = local_68[3] + 4;
  } while (plVar11 != &phVar1->super_node);
  phVar2 = &(args_2->
            super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
            ).m_icont.data_.root_plus_size_.super_header_holder_plus_last_t;
  local_68[4] = 0;
  hVar12.header_holder_.super_node.next_ =
       (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)
       (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)phVar2;
  do {
    hVar12.header_holder_.super_node.next_ =
         *(default_header_holder<boost::intrusive::slist_node_traits<void_*>_> *)
          hVar12.header_holder_.super_node.next_;
    local_68[4] = local_68[4] + 4;
  } while (hVar12.header_holder_.super_node.next_ !=
           (default_header_holder<boost::intrusive::slist_node_traits<void_*>_>)phVar2);
  local_68[5] = (args_3->m_holder).m_size * 4 + 4;
  lVar18 = 0;
  lVar19 = 0;
  lVar15 = 0;
  do {
    lVar18 = lVar18 + local_68[lVar15];
    lVar19 = lVar19 + local_68[lVar15 + 1];
    lVar15 = lVar15 + 2;
  } while (lVar15 != 6);
  uVar3 = lVar19 + lVar18 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar3) &&
       (sVar7 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar7 < uVar3)) &&
      (replaceChannel(this,uVar3),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar3)) &&
     (sVar7 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar7 < uVar3)) {
    bVar6 = false;
  }
  else {
    *(int *)(this->_qw)._writePos = (int)(lVar19 + lVar18);
    pcVar8 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar8 + 4;
    *(uint64_t *)(pcVar8 + 4) = eventSourceId;
    pcVar8 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar8 + 8;
    *(uint64_t *)(pcVar8 + 8) = clock;
    ppcVar4 = &(this->_qw)._writePos;
    *ppcVar4 = *ppcVar4 + 8;
    mserialize::detail::BuiltinSerializer<boost::container::deque<int,_void,_void>,_void>::
    serialize<binlog::detail::QueueWriter>(args,this_00);
    *(int *)(this->_qw)._writePos =
         (int)(args_1->
              super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
              ).m_icont.data_.root_plus_size_.super_size_traits.size_;
    pcVar8 = (this->_qw)._writePos + 4;
    (this->_qw)._writePos = pcVar8;
    for (plVar11 = (args_1->
                   super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
                   ).m_icont.data_.root_plus_size_.m_header.super_node.next_;
        plVar11 != &phVar1->super_node; plVar11 = plVar11->next_) {
      *(undefined4 *)pcVar8 = *(undefined4 *)&plVar11[1].next_;
      pcVar8 = (this->_qw)._writePos + 4;
      (this->_qw)._writePos = pcVar8;
    }
    *(int *)pcVar8 =
         (int)(args_2->
              super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
              ).m_icont.data_.root_plus_size_.super_size_traits.size_;
    piVar9 = (int *)((this->_qw)._writePos + 4);
    (this->_qw)._writePos = (char *)piVar9;
    for (psVar13 = (args_2->
                   super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
                   ).m_icont.data_.root_plus_size_.super_header_holder_plus_last_t.header_holder_.
                   super_node.next_; (header_holder_plus_last_t *)psVar13 != phVar2;
        psVar13 = psVar13->next_) {
      *piVar9 = *(int *)&psVar13[1].next_;
      piVar9 = (int *)((this->_qw)._writePos + 4);
      (this->_qw)._writePos = (char *)piVar9;
    }
    uVar3 = (args_3->m_holder).m_size;
    iVar10 = (int)uVar3;
    *piVar9 = iVar10;
    pcVar8 = (this->_qw)._writePos + 4;
    (this->_qw)._writePos = pcVar8;
    if (iVar10 != 0) {
      __n = (uVar3 & 0xffffffff) * 4;
      memcpy(pcVar8,(args_3->m_holder).m_start,__n);
      pcVar8 = (this->_qw)._writePos + __n;
      (this->_qw)._writePos = pcVar8;
    }
    (this_00->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i =
         (long)pcVar8 - (long)this_00->_queue->buffer;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}